

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O0

void __thiscall
cmTargetCompileOptionsCommand::HandleMissingTarget(cmTargetCompileOptionsCommand *this,string *name)

{
  cmMakefile *this_00;
  ostream *poVar1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  string *name_local;
  cmTargetCompileOptionsCommand *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Cannot specify compile options for target \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\" which is not built by this project.");
  this_00 = (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile;
  std::__cxx11::ostringstream::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void cmTargetCompileOptionsCommand::HandleMissingTarget(
  const std::string& name)
{
  std::ostringstream e;
  e << "Cannot specify compile options for target \"" << name
    << "\" which is not built by this project.";
  this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
}